

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycle.cpp
# Opt level: O3

value_store * __thiscall mpt::cycle::values(cycle *this,uint dim,int nc)

{
  stage *this_00;
  value_store *pvVar1;
  int *piVar2;
  ulong pos;
  
  if (dim < this->_max_dimensions || this->_max_dimensions == 0) {
    pos = (ulong)this->_act;
    if (-1 < nc) {
      pos = (ulong)(uint)nc;
    }
    this_00 = unique_array<mpt::cycle::stage>::get
                        (&(this->_stages).super_unique_array<mpt::cycle::stage>,pos);
    if (this_00 != (stage *)0x0) {
      pvVar1 = rawdata_stage::values(&this_00->super_rawdata_stage,(ulong)dim);
      return pvVar1;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  return (value_store *)0x0;
}

Assistant:

const MPT_STRUCT(value_store) *cycle::values(unsigned dim, int nc) const
{
	if (_max_dimensions && dim >= _max_dimensions) {
		errno = EINVAL;
		return 0;
	}
	if (nc < 0) {
		nc = _act;
	}
	stage *st;
	if (!(st = _stages.get(nc))) {
		return 0;
	}
	return st->rawdata_stage::values(dim);
}